

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O0

void __thiscall
spvtools::AssemblyContext::AssemblyContext
          (AssemblyContext *this,spv_text text,MessageConsumer *consumer,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *ids_to_preserve
          )

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *ids_to_preserve_local;
  MessageConsumer *consumer_local;
  spv_text text_local;
  AssemblyContext *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map(&this->named_ids_);
  std::
  unordered_map<unsigned_int,_spvtools::IdType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>_>
  ::unordered_map(&this->types_);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->value_types_);
  std::
  unordered_map<unsigned_int,_spv_ext_inst_type_t,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>_>
  ::unordered_map(&this->import_id_to_ext_inst_type_);
  memset(&this->current_position_,0,0x18);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&this->consumer_,consumer);
  this->text_ = text;
  this->bound_ = 1;
  this->next_id_ = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->ids_to_preserve_,ids_to_preserve);
  return;
}

Assistant:

AssemblyContext(spv_text text, const MessageConsumer& consumer,
                  std::set<uint32_t>&& ids_to_preserve = std::set<uint32_t>())
      : current_position_({}),
        consumer_(consumer),
        text_(text),
        bound_(1),
        next_id_(1),
        ids_to_preserve_(std::move(ids_to_preserve)) {}